

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MetadataReader::MetadataReader
          (MetadataReader *this,MetadataManager *manager,BlockPointer pointer)

{
  BlockManager *pBVar1;
  idx_t iVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  MetaBlockPointer pointer_00;
  
  pBVar1 = manager->block_manager;
  iVar2 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar3 = optional_idx::GetIndex(&pBVar1->block_header_size);
  if (pointer.block_id == 0xffffffffffffffff) {
    uVar5 = 0xffffffffffffffff;
    uVar4 = 0;
  }
  else {
    uVar6 = iVar2 - iVar3 >> 6 & 0xfffffffffffffff8;
    uVar5 = pointer._8_8_ & 0xffffffff;
    uVar4 = uVar5 % uVar6;
    uVar5 = uVar5 / uVar6 << 0x38 | pointer.block_id;
  }
  pointer_00.offset = (int)uVar4;
  pointer_00.unused_padding = (int)(uVar4 >> 0x20);
  pointer_00.block_pointer = uVar5;
  MetadataReader(this,manager,pointer_00,
                 (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
                 EXISTING_BLOCKS);
  return;
}

Assistant:

MetadataReader::MetadataReader(MetadataManager &manager, BlockPointer pointer)
    : MetadataReader(manager, MetadataManager::FromBlockPointer(pointer, manager.GetMetadataBlockSize())) {
}